

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O0

void __thiscall
DW_HeadLossModel::findHeadLoss
          (DW_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double q_00;
  double dVar1;
  double r1;
  double f;
  double e;
  double dfdq;
  double s;
  double k;
  double r;
  double q;
  double *gradient_local;
  double *headLoss_local;
  double flow_local;
  Pipe *pipe_local;
  DW_HeadLossModel *this_local;
  
  q = (double)gradient;
  gradient_local = headLoss;
  headLoss_local = (double *)flow;
  flow_local = (double)pipe;
  pipe_local = (Pipe *)this;
  std::abs((int)this);
  k = *(double *)((long)flow_local + 0xb0);
  s = *(double *)((long)flow_local + 0xb8);
  dfdq = (this->super_HeadLossModel).viscosity * *(double *)((long)flow_local + 0x48);
  if (dfdq * 1570.79632679 < q_00) {
    e = 0.0;
    r = q_00;
    dVar1 = frictionFactor(q_00,*(double *)((long)flow_local + 0xa8) /
                                *(double *)((long)flow_local + 0x48),dfdq,&e);
    dVar1 = dVar1 * k + s;
    *gradient_local = dVar1 * r * (double)headLoss_local;
    *(double *)q = dVar1 * 2.0 * r + e * k * r * r;
  }
  else {
    dVar1 = dfdq * 50.265482464 * *(double *)((long)flow_local + 0xb0);
    *gradient_local = (double)headLoss_local * (s * q_00 + dVar1);
    *(double *)q = s * 2.0 * q_00 + dVar1;
  }
  return;
}

Assistant:

void DW_HeadLossModel::findHeadLoss(Pipe* pipe, double flow,  double& headLoss,
    double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;
    double s = viscosity * pipe->diameter;

    // ... use Hagen-Poiseuille formula for laminar flow (Re <= 2000)

    if (q <= A2 * s)
    {
        r = 16.0 * PI * s * pipe->resistance;
        headLoss = flow * (r + k * q);
        gradient = r + 2.0 * k * q;
    }

    // ... use Colebrook formula for turbulent flow

    else
    {
        double dfdq = 0.0;
        double e = pipe->roughness / pipe->diameter;
        double f = frictionFactor(q, e, s, dfdq);
        double r1 = f * r + k;
        headLoss = r1 * q * flow;
        gradient = (2.0 * r1 * q) + (dfdq * r * q * q);
    }
}